

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_stats_merge
               (tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms,
               ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy,
               arena_stats_t *astats,bin_stats_data_t *bstats,arena_stats_large_t *lstats,
               pac_estats_t *estats,hpa_shard_stats_t *hpastats,sec_stats_t *secstats)

{
  witness_t **ppwVar1;
  nstime_t *a;
  uint64_t *puVar2;
  bin_stats_data_t *pbVar3;
  malloc_mutex_t *mutex;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  cache_bin_array_descriptor_t *pcVar10;
  cache_bin_array_descriptor_t *pcVar11;
  base_t *pbVar12;
  void *pvVar13;
  witness_t *pwVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  cache_bin_array_descriptor_t *pcVar18;
  uint32_t uVar19;
  atomic_u32_t aVar20;
  int iVar21;
  size_t *psVar22;
  arena_t *paVar23;
  long lVar24;
  ulong uVar25;
  mutex_prof_data_t *data;
  arena_t *paVar26;
  pthread_mutex_t *ppVar27;
  long lVar28;
  cache_bin_info_t *pcVar29;
  ulong uVar30;
  arena_t *paVar31;
  nstime_t *pnVar32;
  size_t metadata_thp;
  size_t base_rtree_allocated;
  size_t base_edata_allocated;
  size_t base_mapped;
  size_t base_resident;
  size_t base_allocated;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  duckdb_je_arena_basic_stats_merge
            (tsdn,arena,nthreads,dss,dirty_decay_ms,muzzy_decay_ms,nactive,ndirty,nmuzzy);
  duckdb_je_base_stats_get
            (tsdn,arena->base,&local_38,&local_50,&local_58,&local_40,&local_48,&local_60);
  astats->mapped = astats->mapped + (((arena->pa_shard).pac.stats)->pac_mapped).repr + local_48;
  astats->resident = astats->resident + local_40;
  astats->base = astats->base + local_38;
  astats->metadata_edata = astats->metadata_edata + local_50;
  astats->metadata_rtree = astats->metadata_rtree + local_58;
  (astats->internal).repr = (astats->internal).repr + (arena->stats).internal.repr;
  astats->metadata_thp = astats->metadata_thp + local_60;
  psVar22 = duckdb_je_sz_index2size_tab + 0x24;
  lVar24 = 0;
  do {
    uVar7 = (&(arena->stats).lstats[0].ndalloc)[lVar24].val.repr;
    (&lstats->ndalloc)[lVar24].val.repr = (&lstats->ndalloc)[lVar24].val.repr + uVar7;
    astats->ndalloc_large = astats->ndalloc_large + uVar7;
    uVar8 = (&(arena->stats).lstats[0].nmalloc)[lVar24].val.repr;
    (&lstats->nmalloc)[lVar24].val.repr = (&lstats->nmalloc)[lVar24].val.repr + uVar8;
    astats->nmalloc_large = astats->nmalloc_large + uVar8;
    lVar28 = (&(arena->stats).lstats[0].nrequests)[lVar24].val.repr + uVar8;
    (&lstats->nrequests)[lVar24].val.repr = (&lstats->nrequests)[lVar24].val.repr + lVar28;
    astats->nrequests_large = astats->nrequests_large + lVar28;
    (&lstats->nfills)[lVar24].val.repr = (&lstats->nfills)[lVar24].val.repr + uVar8;
    astats->nfills_large = astats->nfills_large + uVar8;
    uVar9 = (&(arena->stats).lstats[0].nflushes)[lVar24].val.repr;
    (&lstats->nflushes)[lVar24].val.repr = (&lstats->nflushes)[lVar24].val.repr + uVar9;
    astats->nflushes_large = astats->nflushes_large + uVar9;
    (&lstats->curlextents)[lVar24] = (&lstats->curlextents)[lVar24] + (uVar8 - uVar7);
    astats->allocated_large = astats->allocated_large + (uVar8 - uVar7) * *psVar22;
    lVar24 = lVar24 + 6;
    psVar22 = psVar22 + 1;
  } while (lVar24 != 0x498);
  duckdb_je_pa_shard_stats_merge
            (tsdn,&arena->pa_shard,&astats->pa_shard_stats,estats,hpastats,secstats,
             &astats->resident);
  ppVar27 = (pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48);
  astats->tcache_bytes = 0;
  astats->tcache_stashed_bytes = 0;
  iVar21 = pthread_mutex_trylock(ppVar27);
  if (iVar21 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->tcache_ql_mtx);
    (arena->tcache_ql_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar1 = &(arena->tcache_ql_mtx).field_0.witness.link.qre_prev;
    *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
  }
  pcVar10 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  pcVar18 = pcVar10;
  while (pcVar18 != (cache_bin_array_descriptor_t *)0x0) {
    pcVar29 = &pcVar18->bins->bin_info;
    lVar24 = 0;
    do {
      if (((cache_bin_t *)(pcVar29 + -0xb))->stack_head != (void **)&duckdb_je_disabled_bin) {
        iVar21 = *(int *)(pcVar29 + -1);
        uVar4 = pcVar29->ncached_max;
        uVar5 = pcVar29[-2].ncached_max;
        astats->tcache_bytes =
             astats->tcache_bytes +
             (ulong)((iVar21 - (int)((cache_bin_t *)(pcVar29 + -0xb))->stack_head & 0xffffU) >> 3) *
             duckdb_je_sz_index2size_tab[lVar24];
        astats->tcache_stashed_bytes =
             astats->tcache_stashed_bytes +
             (ulong)((uint)uVar5 - (iVar21 + (uint)uVar4 * -8 & 0xffff) >> 3 & 0xffff) *
             duckdb_je_sz_index2size_tab[lVar24];
      }
      lVar24 = lVar24 + 1;
      pcVar29 = pcVar29 + 0xc;
    } while (lVar24 != 0x49);
    pcVar11 = (pcVar18->link).qre_next;
    pcVar18 = (cache_bin_array_descriptor_t *)0x0;
    if (pcVar11 != pcVar10) {
      pcVar18 = pcVar11;
    }
  }
  uVar7 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar15 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar19 = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x20);
  aVar20.repr = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x24);
  uVar16 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar17 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[8].prev_owner =
       (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[8].n_lock_ops = uVar17;
  astats->mutex_prof_data[8].max_n_thds = uVar19;
  astats->mutex_prof_data[8].n_waiting_thds = (atomic_u32_t)aVar20.repr;
  astats->mutex_prof_data[8].n_owner_switches = uVar16;
  astats->mutex_prof_data[8].n_wait_times = uVar9;
  astats->mutex_prof_data[8].n_spin_acquired = uVar15;
  astats->mutex_prof_data[8].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[8].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[8].n_waiting_thds.repr = 0;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar27);
  ppVar27 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48);
  iVar21 = pthread_mutex_trylock(ppVar27);
  if (iVar21 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
    (arena->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->large_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->large_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar1 = &(arena->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
  }
  uVar7 = (arena->large_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->large_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->large_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar15 = (arena->large_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar19 = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x20);
  aVar20.repr = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x24);
  uVar16 = (arena->large_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar17 = (arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[0].prev_owner = (arena->large_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[0].n_lock_ops = uVar17;
  astats->mutex_prof_data[0].max_n_thds = uVar19;
  astats->mutex_prof_data[0].n_waiting_thds = (atomic_u32_t)aVar20.repr;
  astats->mutex_prof_data[0].n_owner_switches = uVar16;
  astats->mutex_prof_data[0].n_wait_times = uVar9;
  astats->mutex_prof_data[0].n_spin_acquired = uVar15;
  astats->mutex_prof_data[0].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[0].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[0].n_waiting_thds.repr = 0;
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar27);
  pbVar12 = arena->base;
  iVar21 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(pbVar12->mtx).field_0 + 0x48));
  if (iVar21 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pbVar12->mtx);
    (pbVar12->mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(pbVar12->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((pbVar12->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pbVar12->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar1 = &(pbVar12->mtx).field_0.witness.link.qre_prev;
    *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
  }
  pbVar12 = arena->base;
  uVar7 = (pbVar12->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (pbVar12->mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (pbVar12->mtx).field_0.field_0.prof_data.n_wait_times;
  uVar15 = (pbVar12->mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar19 = *(uint32_t *)((long)&(pbVar12->mtx).field_0 + 0x20);
  aVar20.repr = *(uint32_t *)((long)&(pbVar12->mtx).field_0 + 0x24);
  uVar16 = (pbVar12->mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar17 = (pbVar12->mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[7].prev_owner = (pbVar12->mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[7].n_lock_ops = uVar17;
  astats->mutex_prof_data[7].max_n_thds = uVar19;
  astats->mutex_prof_data[7].n_waiting_thds = (atomic_u32_t)aVar20.repr;
  astats->mutex_prof_data[7].n_owner_switches = uVar16;
  astats->mutex_prof_data[7].n_wait_times = uVar9;
  astats->mutex_prof_data[7].n_spin_acquired = uVar15;
  astats->mutex_prof_data[7].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[7].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[7].n_waiting_thds.repr = 0;
  pbVar12 = arena->base;
  (pbVar12->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar12->mtx).field_0 + 0x48));
  duckdb_je_pa_shard_mtx_stats_read(tsdn,&arena->pa_shard,astats->mutex_prof_data);
  pnVar32 = &astats->uptime;
  duckdb_je_nstime_copy(pnVar32,&arena->create_time);
  nstime_update_impl(pnVar32);
  duckdb_je_nstime_subtract(pnVar32,&arena->create_time);
  uVar25 = 0;
  do {
    if (duckdb_je_bin_infos[uVar25].n_shards != 0) {
      pbVar3 = bstats + uVar25;
      pnVar32 = &bstats[uVar25].mutex_data.max_wait_time;
      uVar30 = 0;
      paVar26 = arena;
      paVar31 = arena;
      do {
        paVar23 = paVar26;
        if (uVar25 < duckdb_je_bin_info_nbatched_sizes) {
          paVar23 = paVar31;
        }
        mutex = (malloc_mutex_t *)
                ((long)&paVar23->nthreads[0].repr + (ulong)duckdb_je_arena_bin_offsets[uVar25]);
        ppVar27 = (pthread_mutex_t *)
                  ((long)&((atomic_zu_t *)(paVar23->nthreads + 0x12))->repr +
                  (ulong)duckdb_je_arena_bin_offsets[uVar25]);
        iVar21 = pthread_mutex_trylock(ppVar27);
        if (iVar21 != 0) {
          duckdb_je_malloc_mutex_lock_slow(mutex);
          (mutex->field_0).field_0.locked.repr = true;
        }
        puVar2 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
        *puVar2 = *puVar2 + 1;
        if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
          (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
          ppwVar1 = &(mutex->field_0).witness.link.qre_prev;
          *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
        }
        duckdb_je_nstime_add(&bstats[uVar25].mutex_data.tot_wait_time,(nstime_t *)mutex);
        a = &(mutex->field_0).field_0.prof_data.max_wait_time;
        iVar21 = duckdb_je_nstime_compare(a,pnVar32);
        if (0 < iVar21) {
          duckdb_je_nstime_copy(pnVar32,a);
        }
        pvVar13 = (mutex->field_0).witness.opaque;
        (pbVar3->mutex_data).n_wait_times =
             (uint64_t)((mutex->field_0).witness.comp + (pbVar3->mutex_data).n_wait_times);
        (pbVar3->mutex_data).n_spin_acquired = (pbVar3->mutex_data).n_spin_acquired + (long)pvVar13;
        uVar6 = *(uint *)((long)&mutex->field_0 + 0x20);
        if ((pbVar3->mutex_data).max_n_thds < uVar6) {
          (pbVar3->mutex_data).max_n_thds = uVar6;
        }
        (pbVar3->mutex_data).n_waiting_thds.repr = 0;
        puVar2 = &(pbVar3->mutex_data).n_owner_switches;
        *puVar2 = (long)&((mutex->field_0).witness.link.qre_prev)->name + *puVar2;
        puVar2 = &(pbVar3->mutex_data).n_lock_ops;
        *puVar2 = *puVar2 + (mutex->field_0).field_0.prof_data.n_lock_ops;
        uVar7 = mutex[1].field_0.field_0.prof_data.max_wait_time.ns;
        (pbVar3->stats_data).nmalloc =
             (uint64_t)(mutex[1].field_0.witness.name + (pbVar3->stats_data).nmalloc);
        (pbVar3->stats_data).ndalloc = (pbVar3->stats_data).ndalloc + uVar7;
        pvVar13 = mutex[1].field_0.witness.opaque;
        (pbVar3->stats_data).nrequests =
             (uint64_t)(mutex[1].field_0.witness.comp + (pbVar3->stats_data).nrequests);
        (pbVar3->stats_data).curregs = (long)pvVar13 + (pbVar3->stats_data).curregs;
        pwVar14 = mutex[1].field_0.witness.link.qre_prev;
        (pbVar3->stats_data).nfills =
             (long)&(mutex[1].field_0.witness.link.qre_next)->name + (pbVar3->stats_data).nfills;
        (pbVar3->stats_data).nflushes = (long)&pwVar14->name + (pbVar3->stats_data).nflushes;
        uVar7 = mutex[1].field_0.field_0.prof_data.n_lock_ops;
        (pbVar3->stats_data).nslabs =
             (uint64_t)
             (&((mutex[1].field_0.field_0.prof_data.prev_owner)->tsd).
               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
             (pbVar3->stats_data).nslabs);
        (pbVar3->stats_data).reslabs = (pbVar3->stats_data).reslabs + uVar7;
        lVar24 = *(long *)((long)&mutex[1].field_0 + 0x48);
        (pbVar3->stats_data).curslabs =
             (pbVar3->stats_data).curslabs + *(long *)((long)&mutex[1].field_0 + 0x40);
        (pbVar3->stats_data).nonfull_slabs = (pbVar3->stats_data).nonfull_slabs + lVar24;
        lVar24 = *(long *)((long)&mutex[1].field_0 + 0x60);
        (pbVar3->stats_data).batch_failed_pushes =
             (pbVar3->stats_data).batch_failed_pushes + *(long *)((long)&mutex[1].field_0 + 0x58);
        (pbVar3->stats_data).batch_pushes = (pbVar3->stats_data).batch_pushes + lVar24;
        puVar2 = &(pbVar3->stats_data).batch_pushed_elems;
        *puVar2 = *puVar2 + *(long *)((long)&mutex[1].field_0 + 0x68);
        (mutex->field_0).field_0.locked.repr = false;
        pthread_mutex_unlock(ppVar27);
        uVar30 = uVar30 + 1;
        paVar31 = (arena_t *)&(paVar31->stats).mutex_prof_data[6].n_owner_switches;
        paVar26 = (arena_t *)&(paVar26->stats).mutex_prof_data[0].max_n_thds;
      } while (uVar30 < duckdb_je_bin_infos[uVar25].n_shards);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0x24);
  return;
}

Assistant:

void
arena_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy, arena_stats_t *astats,
    bin_stats_data_t *bstats, arena_stats_large_t *lstats,
    pac_estats_t *estats, hpa_shard_stats_t *hpastats, sec_stats_t *secstats) {
	cassert(config_stats);

	arena_basic_stats_merge(tsdn, arena, nthreads, dss, dirty_decay_ms,
	    muzzy_decay_ms, nactive, ndirty, nmuzzy);

	size_t base_allocated, base_edata_allocated, base_rtree_allocated,
	    base_resident, base_mapped, metadata_thp;
	base_stats_get(tsdn, arena->base, &base_allocated,
	    &base_edata_allocated, &base_rtree_allocated, &base_resident,
	    &base_mapped, &metadata_thp);
	size_t pac_mapped_sz = pac_mapped(&arena->pa_shard.pac);
	astats->mapped += base_mapped + pac_mapped_sz;
	astats->resident += base_resident;

	LOCKEDINT_MTX_LOCK(tsdn, arena->stats.mtx);

	astats->base += base_allocated;
	astats->metadata_edata += base_edata_allocated;
	astats->metadata_rtree += base_rtree_allocated;
	atomic_load_add_store_zu(&astats->internal, arena_internal_get(arena));
	astats->metadata_thp += metadata_thp;

	for (szind_t i = 0; i < SC_NSIZES - SC_NBINS; i++) {
		/* ndalloc should be read before nmalloc,
		 * since otherwise it is possible for ndalloc to be incremented,
		 * and the following can become true: ndalloc > nmalloc */
		uint64_t ndalloc = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].ndalloc);
		locked_inc_u64_unsynchronized(&lstats[i].ndalloc, ndalloc);
		astats->ndalloc_large += ndalloc;

		uint64_t nmalloc = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].nmalloc);
		locked_inc_u64_unsynchronized(&lstats[i].nmalloc, nmalloc);
		astats->nmalloc_large += nmalloc;

		uint64_t nrequests = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].nrequests);
		locked_inc_u64_unsynchronized(&lstats[i].nrequests,
		    nmalloc + nrequests);
		astats->nrequests_large += nmalloc + nrequests;

		/* nfill == nmalloc for large currently. */
		locked_inc_u64_unsynchronized(&lstats[i].nfills, nmalloc);
		astats->nfills_large += nmalloc;

		uint64_t nflush = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].nflushes);
		locked_inc_u64_unsynchronized(&lstats[i].nflushes, nflush);
		astats->nflushes_large += nflush;

		assert(nmalloc >= ndalloc);
		assert(nmalloc - ndalloc <= SIZE_T_MAX);
		size_t curlextents = (size_t)(nmalloc - ndalloc);
		lstats[i].curlextents += curlextents;
		astats->allocated_large +=
		    curlextents * sz_index2size(SC_NBINS + i);
	}

	pa_shard_stats_merge(tsdn, &arena->pa_shard, &astats->pa_shard_stats,
	    estats, hpastats, secstats, &astats->resident);

	LOCKEDINT_MTX_UNLOCK(tsdn, arena->stats.mtx);

	/* Currently cached bytes and sanitizer-stashed bytes in tcache. */
	astats->tcache_bytes = 0;
	astats->tcache_stashed_bytes = 0;
	malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
	cache_bin_array_descriptor_t *descriptor;
	ql_foreach(descriptor, &arena->cache_bin_array_descriptor_ql, link) {
		for (szind_t i = 0; i < TCACHE_NBINS_MAX; i++) {
			cache_bin_t *cache_bin = &descriptor->bins[i];
			if (cache_bin_disabled(cache_bin)) {
				continue;
			}

			cache_bin_sz_t ncached, nstashed;
			cache_bin_nitems_get_remote(cache_bin, &ncached, &nstashed);
			astats->tcache_bytes += ncached * sz_index2size(i);
			astats->tcache_stashed_bytes += nstashed *
			    sz_index2size(i);
		}
	}
	malloc_mutex_prof_read(tsdn,
	    &astats->mutex_prof_data[arena_prof_mutex_tcache_list],
	    &arena->tcache_ql_mtx);
	malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);

#define READ_ARENA_MUTEX_PROF_DATA(mtx, ind)				\
    malloc_mutex_lock(tsdn, &arena->mtx);				\
    malloc_mutex_prof_read(tsdn, &astats->mutex_prof_data[ind],		\
        &arena->mtx);							\
    malloc_mutex_unlock(tsdn, &arena->mtx);

	/* Gather per arena mutex profiling data. */
	READ_ARENA_MUTEX_PROF_DATA(large_mtx, arena_prof_mutex_large);
	READ_ARENA_MUTEX_PROF_DATA(base->mtx,
	    arena_prof_mutex_base);
#undef READ_ARENA_MUTEX_PROF_DATA
	pa_shard_mtx_stats_read(tsdn, &arena->pa_shard,
	    astats->mutex_prof_data);

	nstime_copy(&astats->uptime, &arena->create_time);
	nstime_update(&astats->uptime);
	nstime_subtract(&astats->uptime, &arena->create_time);

	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_stats_merge(tsdn, &bstats[i],
			    arena_get_bin(arena, i, j));
		}
	}
}